

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

object * __thiscall
jessilib::parser::deserialize_bytes
          (object *__return_storage_ptr__,parser *this,istream *in_stream,
          text_encoding in_read_encoding)

{
  byte bVar1;
  long lVar2;
  reference __str;
  size_type __len;
  basic_string_view<char,_std::char_traits<char>_> local_480;
  char *local_470;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_468;
  const_iterator local_460;
  char local_448 [8];
  char buffer [1024];
  undefined1 local_40 [8];
  vector<char,_std::allocator<char>_> data;
  text_encoding in_read_encoding_local;
  istream *in_stream_local;
  parser *this_local;
  
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = in_read_encoding;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_40);
  while( true ) {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    std::istream::read((char *)in_stream,(long)local_448);
    local_468._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::end
                           ((vector<char,_std::allocator<char>_> *)local_40);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_460,
               &local_468);
    lVar2 = std::istream::gcount();
    local_470 = (char *)std::vector<char,std::allocator<char>>::insert<char*,void>
                                  ((vector<char,std::allocator<char>> *)local_40,local_460,local_448
                                   ,local_448 + lVar2);
  }
  __str = std::vector<char,_std::allocator<char>_>::front
                    ((vector<char,_std::allocator<char>_> *)local_40);
  __len = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_480,__str,__len);
  (*this->_vptr_parser[3])
            (__return_storage_ptr__,this,local_480._M_len,local_480._M_str,
             (ulong)(uint)data.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_40)
  ;
  return __return_storage_ptr__;
}

Assistant:

object parser::deserialize_bytes(std::istream& in_stream, text_encoding in_read_encoding) {
	std::vector<byte_type> data;

	// Read entire stream into data
	char buffer[1024];
	while(!in_stream.eof()) {
		in_stream.read(buffer, sizeof(buffer));
		data.insert(data.end(), buffer, buffer + in_stream.gcount());
	}

	// Pass data to deserialize
	return deserialize_bytes(bytes_view_type{ &data.front(), data.size() }, in_read_encoding);
}